

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::FormattingScene::Rotate
          (FormattingScene *this,Float angle,Float ax,Float ay,Float az,FileLoc loc)

{
  Float local_60;
  Float local_5c;
  Float local_58;
  Float local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_60 = az;
  local_5c = ay;
  local_58 = ax;
  local_54 = angle;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct
            ((ulong)&local_50,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
  Printf<std::__cxx11::string,float&,float&,float&,float&>
            ("%sRotate %f %f %f %f\n",&local_50,&local_54,&local_58,&local_5c,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FormattingScene::Rotate(Float angle, Float ax, Float ay, Float az, FileLoc loc) {
    Printf("%sRotate %f %f %f %f\n", indent(), angle, ax, ay, az);
}